

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferObjectQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BufferParamVerifiers::GetBufferParameterIVerifier::verifyInteger64
          (GetBufferParameterIVerifier *this,TestContext *testCtx,GLenum target,GLenum name,
          GLint64 reference)

{
  undefined8 x;
  bool bVar1;
  int iVar2;
  int iVar3;
  qpTestResult qVar4;
  int *piVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  MessageBuilder local_1b8;
  undefined1 local_34 [8];
  StateQueryMemoryWriteGuard<int> state;
  GLint64 reference_local;
  GLenum name_local;
  GLenum target_local;
  TestContext *testCtx_local;
  GetBufferParameterIVerifier *this_local;
  
  state._4_8_ = reference;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_34);
  piVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_34);
  glu::CallLogWrapper::glGetBufferParameteriv
            (&(this->super_BufferParamVerifier).super_CallLogWrapper,target,name,piVar5);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_34,testCtx);
  x = state._4_8_;
  if (bVar1) {
    iVar2 = std::numeric_limits<int>::min();
    iVar3 = std::numeric_limits<int>::max();
    bVar1 = de::inRange<long>(x,(long)iVar2,(long)iVar3);
    if ((bVar1) &&
       (piVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                           ((StateQueryMemoryWriteGuard *)local_34), (long)*piVar5 != state._4_8_))
    {
      this_00 = tcu::TestContext::getLog(testCtx);
      tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [20])"// ERROR: expected ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(long *)&state.m_value);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x2b8b5f6);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(StateQueryMemoryWriteGuard<int> *)local_34);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b8);
      qVar4 = tcu::TestContext::getTestResult(testCtx);
      if (qVar4 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid value");
      }
    }
  }
  return;
}

Assistant:

void GetBufferParameterIVerifier::verifyInteger64 (tcu::TestContext& testCtx, GLenum target, GLenum name, GLint64 reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint> state;
	glGetBufferParameteriv(target, name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	// check that the converted value would be in the correct range, otherwise checking wont tell us anything
	if (!de::inRange(reference, (GLint64)std::numeric_limits<GLint>::min(), (GLint64)std::numeric_limits<GLint>::max()))
		return;

	if (state != reference)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << reference << "; got " << state << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid value");
	}
}